

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O0

void test_pax_filename_encoding_1(void)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  archive_entry *local_28;
  archive_entry *entry;
  archive *a;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char filename [13];
  
  a._3_1_ = 'a';
  a._4_1_ = 'b';
  a._5_1_ = 'c';
  a._6_1_ = -0x34;
  a._7_1_ = -0x74;
  cStack_10 = 'm';
  cStack_f = 'n';
  cStack_e = 'o';
  filename[0] = -4;
  filename[1] = 'x';
  filename[2] = 'y';
  filename[3] = 'z';
  filename[4] = '\0';
  extract_reference_file("test_pax_filename_encoding.tar");
  entry = (archive_entry *)archive_read_new();
  wVar1 = archive_read_support_format_tar((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L';',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_tar(a)",
                      (void *)0x0);
  iVar2 = archive_read_support_filter_all((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                      (void *)0x0);
  wVar1 = archive_read_open_filename
                    ((archive_conflict *)entry,"test_pax_filename_encoding.tar",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'>',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_open_filename(a, testname, 10240)",(void *)0x0);
  failure("Invalid UTF8 in a pax archive pathname should cause a warning");
  iVar2 = archive_read_next_header((archive *)entry,&local_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'E',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_next_header(a, &entry)",
                      (void *)0x0);
  pcVar3 = archive_entry_pathname(local_28);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
             ,L'F',(char *)((long)&a + 3),"filename",pcVar3,"archive_entry_pathname(entry)",
             (void *)0x0,L'\0');
  failure(
         "A pathname with hdrcharset=BINARY can have invalid UTF8\n characters in it without generating a warning"
         );
  iVar2 = archive_read_next_header((archive *)entry,&local_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &entry)",
                      (void *)0x0);
  pcVar3 = archive_entry_pathname(local_28);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
             ,L'N',(char *)((long)&a + 3),"filename",pcVar3,"archive_entry_pathname(entry)",
             (void *)0x0,L'\0');
  archive_read_free((archive *)entry);
  return;
}

Assistant:

static void
test_pax_filename_encoding_1(void)
{
	static const char testname[] = "test_pax_filename_encoding.tar";
	/*
	 * \314\214 is a valid 2-byte UTF-8 sequence.
	 * \374 is invalid in UTF-8.
	 */
	char filename[] = "abc\314\214mno\374xyz";
	struct archive *a;
	struct archive_entry *entry;

	/*
	 * Read an archive that has non-UTF8 pax filenames in it.
	 */
	extract_reference_file(testname);
	a = archive_read_new();
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_tar(a));
	assertEqualInt(ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, testname, 10240));
	/*
	 * First entry in this test archive has an invalid UTF-8 sequence
	 * in it, but the header is not marked as hdrcharset=BINARY, so that
	 * requires a warning.
	 */
	failure("Invalid UTF8 in a pax archive pathname should cause a warning");
	assertEqualInt(ARCHIVE_WARN, archive_read_next_header(a, &entry));
	assertEqualString(filename, archive_entry_pathname(entry));
	/*
	 * Second entry is identical except that it does have
	 * hdrcharset=BINARY, so no warning should be generated.
	 */
	failure("A pathname with hdrcharset=BINARY can have invalid UTF8\n"
	    " characters in it without generating a warning");
	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &entry));
	assertEqualString(filename, archive_entry_pathname(entry));
	archive_read_free(a);
}